

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor.h
# Opt level: O1

void __thiscall
Fixpp::impl::FieldParser<Fixpp::FieldRef<Fixpp::TagT<95u,Fixpp::Type::Int>>>::
parse<Fixpp::impl::TagSet<Fixpp::VersionnedMessageRef<Fixpp::v44::Version,Fixpp::Chars<(char)66,(char)70>,Fixpp::Required<Fixpp::TagT<923u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<924u,Fixpp::Type::Int>>,Fixpp::Required<Fixpp::TagT<553u,Fixpp::Type::String>>,Fixpp::TagT<554u,Fixpp::Type::String>,Fixpp::TagT<925u,Fixpp::Type::Int>,Fixpp::TagT<95u,Fixpp::Type::Int>,Fixpp::TagT<96u,Fixpp::Type::Data>>>>
          (FieldParser<Fixpp::FieldRef<Fixpp::TagT<95u,Fixpp::Type::Int>>> *this,Field *field,
          ParsingContext *context,
          TagSet<Fixpp::VersionnedMessageRef<Fixpp::v44::Version,_Fixpp::Chars<_B_,__F_>,_Fixpp::Required<Fixpp::TagT<923U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<924U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<553U,_Fixpp::Type::String>_>,_Fixpp::TagT<554U,_Fixpp::Type::String>,_Fixpp::TagT<925U,_Fixpp::Type::Int>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>_>_>
          *tagSet,bool param_4,bool param_5)

{
  byte *pbVar1;
  StreamCursor *this_00;
  long lVar2;
  StreamBuf<char> *pSVar3;
  long lVar4;
  char cVar5;
  bool bVar6;
  long lVar7;
  char *pcVar8;
  Type type;
  
  this_00 = context->cursor;
  lVar2 = *(long *)&this_00->buf->field_0x8;
  pcVar8 = *(char **)&this_00->buf->field_0x10;
  while( true ) {
    pSVar3 = this_00->buf;
    if (*(long *)&pSVar3->field_0x18 == *(long *)&pSVar3->field_0x10) {
      lVar7 = (**(code **)(*(long *)pSVar3 + 0x38))();
      bVar6 = lVar7 == 0;
    }
    else {
      bVar6 = false;
    }
    if (bVar6) {
      pcVar8 = "Expected value tag \'%d\', got EOF";
      type = ParsingError;
      goto LAB_009cebcb;
    }
    pSVar3 = this_00->buf;
    if (*(char **)&pSVar3->field_0x10 < *(char **)&pSVar3->field_0x18) {
      cVar5 = **(char **)&pSVar3->field_0x10;
    }
    else {
      cVar5 = (**(code **)(*(long *)pSVar3 + 0x48))();
    }
    if (cVar5 == '|') break;
    StreamCursor::advance(this_00,1);
  }
  lVar7 = *(long *)&this_00->buf->field_0x8;
  lVar4 = *(long *)&this_00->buf->field_0x10;
  bVar6 = StreamCursor::advance(this_00,1);
  if (bVar6) {
    (field->m_view).first = pcVar8;
    (field->m_view).second = (lVar2 + lVar4) - (long)(pcVar8 + lVar7);
    pbVar1 = (byte *)((long)(tagSet->
                            super_TagSet<Fixpp::Required<Fixpp::TagT<923U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<924U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<553U,_Fixpp::Type::String>_>,_Fixpp::TagT<554U,_Fixpp::Type::String>,_Fixpp::TagT<925U,_Fixpp::Type::Int>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>_>
                            ).bits.super__Base_bitset<15UL>._M_w + 0xb);
    *pbVar1 = *pbVar1 | 0x80;
    return;
  }
  pcVar8 = "Expected value after tag \'%d\', got EOF";
  type = Incomplete;
LAB_009cebcb:
  ParsingContext::setError(context,type,pcVar8,0x5f);
  return;
}

Assistant:

void parse(Field& field, ParsingContext& context, TagSet& tagSet, bool /* strict */, bool /* skipUnknown */)
            {
                auto& cursor = context.cursor;
                // @Todo: In Strict mode, validate the type of the Tag
                StreamCursor::Token valueToken(context.cursor);
                TRY_MATCH_UNTIL(SOH, "Expected value tag '%d', got EOF", TagT::Id);

                auto view = valueToken.view();
                TRY_ADVANCE("Expected value after tag '%d', got EOF", TagT::Id);

                field.set(view);
                tagSet.set(field.tag());
            }